

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Stress::FenceSyncCase::iterate(FenceSyncCase *this)

{
  deBool dVar1;
  deUint32 program;
  GLenum GVar2;
  TestError *pTVar3;
  reference pointer;
  MessageBuilder *pMVar4;
  GLsync p_Var5;
  reference pp_Var6;
  size_type sVar7;
  int iVar8;
  vector<__GLsync_*,_std::allocator<__GLsync_*>_> *this_00;
  char (*local_e58) [8];
  MessageBuilder local_d58;
  undefined4 local_bd4;
  MessageBuilder local_bd0;
  __GLsync **local_a50;
  __normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_> local_a48;
  const_iterator local_a40;
  __normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_> local_a38;
  const_iterator local_a30;
  int local_a24;
  undefined1 local_a20 [4];
  int i_2;
  MessageBuilder local_8a0;
  GLenum local_720;
  int local_71c;
  GLenum waitValue;
  int i_1;
  MessageBuilder local_598;
  __GLsync **local_418;
  __normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_> local_410;
  MessageBuilder local_408;
  int local_284;
  undefined1 local_280 [4];
  int i;
  ScopedLogSection local_100;
  ScopedLogSection section;
  int local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string header;
  undefined1 local_38 [7];
  bool testOk;
  vector<float,_std::allocator<float>_> vertices;
  TestLog *log;
  FenceSyncCase *this_local;
  
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  header.field_2._M_local_buf[0xf] = '\x01';
  local_c4 = this->m_iterNdx + 1;
  de::toString<int>(&local_c0,&local_c4);
  std::operator+(&local_a0,"Case iteration ",&local_c0);
  std::operator+(&local_80,&local_a0," / ");
  de::toString<int>((string *)&section,&NUM_CASE_ITERATIONS);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  tcu::ScopedLogSection::ScopedLogSection
            (&local_100,
             (TestLog *)
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(string *)local_60,(string *)local_60);
  glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  while ((dVar1 = ::deGetFalse(), dVar1 == 0 && (this->m_program != (ShaderProgram *)0x0))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      program = glu::ShaderProgram::getProgram(this->m_program);
      glwUseProgram(program);
      glwEnable(0xb71);
      glwClearColor(0.3,0.3,0.3,1.0);
      glwClearDepthf(1.0);
      glwClear(0x4100);
      glwEnableVertexAttribArray(0);
      generateVertices((vector<float,_std::allocator<float>_> *)local_38,
                       *(int *)&(this->super_CallLogWrapper).field_0x14,&this->m_rnd);
      pointer = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_38,0);
      glwVertexAttribPointer(0,4,0x1406,'\0',0,pointer);
      std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::resize
                (&this->m_syncObjects,(long)*(int *)&(this->super_CallLogWrapper).field_0x14);
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_280,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_280,(char (*) [16])"// NOT LOGGED: ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(int *)&(this->super_CallLogWrapper).field_0x14);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [47])" glDrawArrays and glFenceSync calls done here.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_280);
      for (local_284 = 0; local_284 < *(int *)&(this->super_CallLogWrapper).field_0x14;
          local_284 = local_284 + 1) {
        glwDrawArrays(4,local_284 * 3,3);
        p_Var5 = glwFenceSync(0x9117,0);
        pp_Var6 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                            (&this->m_syncObjects,(long)local_284);
        *pp_Var6 = p_Var5;
        GVar2 = glwGetError();
        glu::checkError(GVar2,"Sync object created",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                        ,0xc1);
      }
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
      tcu::TestLog::operator<<
                (&local_408,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_408,(char (*) [42])"// Draws performed, sync objects created.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_408);
      local_410._M_current =
           (__GLsync **)
           std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::begin(&this->m_syncObjects);
      local_418 = (__GLsync **)
                  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::end(&this->m_syncObjects);
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<__GLsync**,std::vector<__GLsync*,std::allocator<__GLsync*>>>>
                (&this->m_rnd,local_410,
                 (__normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>
                  )local_418);
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
      if ((this->m_waitCommand & 1) == 0) {
        if ((this->m_waitCommand & 2) != 0) {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&waitValue,
                     (TestLog *)
                     vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&waitValue,(char (*) [16])"// NOT LOGGED: ");
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(int *)&(this->super_CallLogWrapper).field_0x14);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [35])" glClientWaitSync calls done here.");
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&waitValue);
        }
      }
      else {
        tcu::TestLog::operator<<
                  (&local_598,
                   (TestLog *)
                   vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_598,(char (*) [16])"// NOT LOGGED: ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(int *)&(this->super_CallLogWrapper).field_0x14);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [29])" glWaitSync calls done here.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_598);
      }
      for (local_71c = 0; local_71c < *(int *)&(this->super_CallLogWrapper).field_0x14;
          local_71c = local_71c + 1) {
        local_720 = 0;
        if ((this->m_waitCommand & 1) == 0) {
          if ((this->m_waitCommand & 2) != 0) {
            pp_Var6 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                                (&this->m_syncObjects,(long)local_71c);
            local_720 = glwClientWaitSync(*pp_Var6,0,100);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glClientWaitSync called",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                            ,0xdc);
            switch(local_720) {
            case 0x911a:
              break;
            case 0x911b:
              break;
            case 0x911c:
              break;
            case 0x911d:
              tcu::TestLog::operator<<
                        (&local_8a0,
                         (TestLog *)
                         vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar4 = tcu::MessageBuilder::operator<<
                                 (&local_8a0,
                                  (char (*) [44])"// glClientWaitSync returned GL_WAIT_FAILED");
              tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_8a0);
              header.field_2._M_local_buf[0xf] = '\0';
              break;
            default:
              pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar3,"glClientWaitSync returned an unknown return value.",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                         ,0xe3);
              __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
        }
        else {
          pp_Var6 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                              (&this->m_syncObjects,(long)local_71c);
          glwWaitSync(*pp_Var6,0,0xffffffffffffffff);
          GVar2 = glwGetError();
          glu::checkError(GVar2,"glWaitSync called",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                          ,0xd7);
        }
      }
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
      glwFinish();
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_a20,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_a20,(char (*) [16])"// NOT LOGGED: ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(int *)&(this->super_CallLogWrapper).field_0x14);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [31])" glDeleteSync calls done here.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_a20);
      for (local_a24 = 0; iVar8 = local_a24,
          sVar7 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::size(&this->m_syncObjects),
          iVar8 < (int)sVar7; local_a24 = local_a24 + 1) {
        pp_Var6 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                            (&this->m_syncObjects,(long)local_a24);
        if (*pp_Var6 != (value_type)0x0) {
          pp_Var6 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                              (&this->m_syncObjects,(long)local_a24);
          glwDeleteSync(*pp_Var6);
          GVar2 = glwGetError();
          glu::checkError(GVar2,"Sync object deleted",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                          ,0xf5);
        }
      }
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
      this_00 = &this->m_syncObjects;
      local_a38._M_current =
           (__GLsync **)std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::begin(this_00);
      __gnu_cxx::__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>>
      ::__normal_iterator<__GLsync**>
                ((__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>>
                  *)&local_a30,&local_a38);
      local_a48._M_current =
           (__GLsync **)std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::end(this_00);
      __gnu_cxx::__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>>
      ::__normal_iterator<__GLsync**>
                ((__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>>
                  *)&local_a40,&local_a48);
      local_a50 = (__GLsync **)
                  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::erase
                            (this_00,local_a30,local_a40);
      tcu::TestLog::operator<<
                (&local_bd0,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_bd0,(char (*) [17])"// Test result: ");
      if ((header.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_e58 = (char (*) [8])0x2b15d68;
      }
      else {
        local_e58 = (char (*) [8])0x2bab9df;
      }
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_e58);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_bd0);
      if ((header.field_2._M_local_buf[0xf] & 1U) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        this_local._4_4_ = STOP;
      }
      else {
        tcu::TestLog::operator<<
                  (&local_d58,
                   (TestLog *)
                   vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_d58,
                            (char (*) [50])"// Sync objects created and deleted successfully.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d58);
        iVar8 = this->m_iterNdx + 1;
        this->m_iterNdx = iVar8;
        this_local._4_4_ = (IterateResult)(iVar8 < 1);
      }
      local_bd4 = 1;
      tcu::ScopedLogSection::~ScopedLogSection(&local_100);
      std::__cxx11::string::~string((string *)local_60);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_38);
      return this_local._4_4_;
    }
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,(char *)0x0,"m_program",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
             ,0xaa);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

FenceSyncCase::IterateResult FenceSyncCase::iterate (void)
{
	TestLog&				log		= m_testCtx.getLog();
	std::vector<float>		vertices;
	bool					testOk	= true;

	std::string				header	= "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	tcu::ScopedLogSection	section	(log, header, header);

	enableLogging(true);

	TCU_CHECK		(m_program);
	glUseProgram	(m_program->getProgram());
	glEnable		(GL_DEPTH_TEST);
	glClearColor	(0.3f, 0.3f, 0.3f, 1.0f);
	glClearDepthf	(1.0f);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray	(0);
	generateVertices			(vertices, m_numSyncs, m_rnd);
	glVertexAttribPointer		(0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);
	m_syncObjects.resize		(m_numSyncs);

	// Perform draws and create sync objects

	enableLogging(false);
	log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glDrawArrays and glFenceSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < m_numSyncs; i++)
	{
		glDrawArrays(GL_TRIANGLES, i*3, 3);
		m_syncObjects[i] = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_CHECK_MSG("Sync object created");
	}
	enableLogging(true);
	log << TestLog::Message << "// Draws performed, sync objects created." << TestLog::EndMessage;

	// Wait for sync objects

	m_rnd.shuffle(m_syncObjects.begin(), m_syncObjects.end());

	enableLogging(false);
	if (m_waitCommand & COMMAND_WAIT_SYNC)
		log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glWaitSync calls done here." << TestLog::EndMessage;
	else if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
		log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glClientWaitSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < m_numSyncs; i++)
	{
		GLenum waitValue = 0;

		if (m_waitCommand & COMMAND_WAIT_SYNC)
		{
			glWaitSync(m_syncObjects[i], 0, GL_TIMEOUT_IGNORED);
			GLU_CHECK_MSG("glWaitSync called");
		}
		else if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
		{
			waitValue = glClientWaitSync(m_syncObjects[i], 0, 100);
			GLU_CHECK_MSG("glClientWaitSync called");
			switch (waitValue)
			{
				case GL_ALREADY_SIGNALED:	 break;
				case GL_TIMEOUT_EXPIRED:	 break;
				case GL_CONDITION_SATISFIED: break;
				case GL_WAIT_FAILED:		 log << TestLog::Message << "// glClientWaitSync returned GL_WAIT_FAILED"	<< TestLog::EndMessage; testOk = false; break;
				default:					 TCU_FAIL("glClientWaitSync returned an unknown return value.");
			}
		}
	}
	enableLogging(true);

	glFinish();

	// Delete sync objects

	enableLogging(false);
	log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glDeleteSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < (int)m_syncObjects.size(); i++)
	{
		if (m_syncObjects[i])
		{
			glDeleteSync(m_syncObjects[i]);
			GLU_CHECK_MSG("Sync object deleted");
		}
	}

	enableLogging(true);

	m_syncObjects.erase(m_syncObjects.begin(), m_syncObjects.end());

	// Evaluate test result

	log << TestLog::Message << "// Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "// Sync objects created and deleted successfully." << TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}